

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocatorStrategy.hpp
# Opt level: O3

string * __thiscall
license::locate::LocatorStrategy::get_strategy_name_abi_cxx11_
          (string *__return_storage_ptr__,LocatorStrategy *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_strategy_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_strategy_name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

const virtual std::string get_strategy_name() const { return m_strategy_name; }